

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O3

void Omega_h::make_1d_box(Real x,LO nx,LOs *ev2v_out,Reals *coords_out)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  IntIterator last;
  Alloc *pAVar5;
  Alloc *pAVar6;
  IntIterator last_1;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  Write<int> ev2v;
  Write<double> coords;
  undefined1 local_a8 [40];
  Real local_80;
  Write<int> local_78;
  Write<double> local_68;
  Alloc *local_58;
  Write<double> local_50;
  Write<int> local_40;
  long lVar13;
  
  pAVar6 = (Alloc *)(local_a8 + 0x10);
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = pAVar6;
  local_80 = x;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  iVar4 = nx + 1;
  Write<double>::Write(&local_68,iVar4,(string *)local_a8);
  if ((Alloc *)local_a8._0_8_ != pAVar6) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_58 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  bVar7 = local_58 != (Alloc *)0x0;
  bVar8 = ((ulong)local_58 & 7) == 0;
  pAVar5 = local_58;
  if (bVar8 && bVar7) {
    if (entering_parallel == '\x01') {
      pAVar5 = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  bVar9 = ((ulong)pAVar5 & 7) == 0;
  if (nx < 0) {
    if (bVar9 && pAVar5 != (Alloc *)0x0) goto LAB_0023047d;
  }
  else {
    if (bVar9 && pAVar5 != (Alloc *)0x0) {
      pAVar5->use_count = pAVar5->use_count + -1;
      pAVar5 = (Alloc *)(pAVar5->size * 8 + 1);
    }
    auVar2 = _DAT_00443a40;
    local_80 = local_80 / (double)nx;
    entering_parallel = '\0';
    auVar11._4_4_ = 0;
    auVar11._0_4_ = nx;
    auVar11._8_4_ = nx;
    auVar11._12_4_ = 0;
    uVar3 = 0;
    auVar11 = auVar11 ^ _DAT_00443a40;
    auVar12 = _DAT_00443a30;
    do {
      auVar14 = auVar12 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        *(double *)((long)local_68.shared_alloc_.direct_ptr + uVar3 * 8) =
             (double)(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                          (long)iVar4) * local_80;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        *(double *)((long)local_68.shared_alloc_.direct_ptr + uVar3 * 8 + 8) =
             (double)(((int)uVar3 + 1) % iVar4) * local_80;
      }
      uVar3 = uVar3 + 2;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
    } while ((nx & 0x7ffffffeU) + 2 != uVar3);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
LAB_0023047d:
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
  }
  local_a8._0_8_ = pAVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  Write<int>::Write(&local_78,nx * 2,(string *)local_a8);
  if ((Alloc *)local_a8._0_8_ != pAVar6) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pAVar6 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      pAVar6 = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  bVar9 = ((ulong)pAVar6 & 7) == 0;
  pAVar5 = pAVar6;
  if (bVar9 && pAVar6 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar5 = (Alloc *)(pAVar6->size * 8 + 1);
    }
    else {
      pAVar6->use_count = pAVar6->use_count + 1;
    }
  }
  bVar10 = ((ulong)pAVar5 & 7) != 0;
  if (nx < 1) {
    if (bVar10 || pAVar5 == (Alloc *)0x0) goto LAB_002305dc;
  }
  else {
    if (!bVar10 && pAVar5 != (Alloc *)0x0) {
      pAVar5->use_count = pAVar5->use_count + -1;
      pAVar5 = (Alloc *)(pAVar5->size * 8 + 1);
    }
    entering_parallel = '\0';
    uVar3 = 0;
    do {
      iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                   (long)nx);
      *(int *)((long)local_78.shared_alloc_.direct_ptr + uVar3 * 8) = iVar4;
      *(int *)((long)local_78.shared_alloc_.direct_ptr + uVar3 * 8 + 4) = iVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (nx != (int)uVar3);
    if (((ulong)pAVar5 & 7) != 0 || pAVar5 == (Alloc *)0x0) goto LAB_002305dc;
  }
  piVar1 = &pAVar5->use_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    Alloc::~Alloc(pAVar5);
    operator_delete(pAVar5,0x48);
  }
LAB_002305dc:
  local_40.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  Read<int>::Read((Read<signed_char> *)local_a8,&local_40);
  pAVar5 = (ev2v_out->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_40.shared_alloc_.alloc;
  (ev2v_out->write_).shared_alloc_.alloc = (Alloc *)local_a8._0_8_;
  (ev2v_out->write_).shared_alloc_.direct_ptr = (void *)local_a8._8_8_;
  if (((local_a8._0_16_ & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
       (Alloc *)local_a8._0_8_ != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_a8._0_8_ + 0x30) = *(int *)(local_a8._0_8_ + 0x30) + -1;
    (ev2v_out->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_a8._0_8_ * 8 + 1);
  }
  local_a8._0_8_ = (Alloc *)0x0;
  local_a8._8_8_ = (void *)0x0;
  if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 && local_40.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_50.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_a8,&local_50);
  pAVar5 = (coords_out->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_50.shared_alloc_.alloc;
  (coords_out->write_).shared_alloc_.alloc = (Alloc *)local_a8._0_8_;
  (coords_out->write_).shared_alloc_.direct_ptr = (void *)local_a8._8_8_;
  if (((local_a8._0_16_ & (undefined1  [16])0x7) == (undefined1  [16])0x0 &&
       (Alloc *)local_a8._0_8_ != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_a8._0_8_ + 0x30) = *(int *)(local_a8._0_8_ + 0x30) + -1;
    (coords_out->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_a8._0_8_ * 8 + 1);
  }
  local_a8._0_8_ = (Alloc *)0x0;
  local_a8._8_8_ = (void *)0x0;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  if (bVar9 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(local_78.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_58;
  if (bVar8 && bVar7) {
    piVar1 = &local_58->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58);
      operator_delete(pAVar6,0x48);
    }
  }
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(local_68.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void make_1d_box(Real x, LO nx, LOs* ev2v_out, Reals* coords_out) {
  LO ne = nx;
  LO nv = nx + 1;
  Real dx = x / nx;
  Write<Real> coords(nv);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO i = v % nv;
    coords[v] = i * dx;
  };
  parallel_for(nv, fill_coords, "make_1d_box(coords)");
  Write<LO> ev2v(ne * 2);
  auto fill_conn = OMEGA_H_LAMBDA(LO q) {
    LO i = q % ne;
    ev2v[q * 2 + 0] = i + 0;
    ev2v[q * 2 + 1] = i + 1;
  };
  parallel_for(ne, fill_conn, "make_1d_box(conn)");
  *ev2v_out = ev2v;
  *coords_out = coords;
}